

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O0

void freeBindings(XML_Parser parser,BINDING *bindings)

{
  binding *pbVar1;
  BINDING *b;
  BINDING *bindings_local;
  XML_Parser parser_local;
  
  b = bindings;
  while (b != (BINDING *)0x0) {
    if (parser->m_endNamespaceDeclHandler != (XML_EndNamespaceDeclHandler)0x0) {
      (*parser->m_endNamespaceDeclHandler)(parser->m_handlerArg,b->prefix->name);
    }
    pbVar1 = b->nextTagBinding;
    b->nextTagBinding = parser->m_freeBindingList;
    parser->m_freeBindingList = b;
    b->prefix->binding = b->prevPrefixBinding;
    b = pbVar1;
  }
  return;
}

Assistant:

static void
freeBindings(XML_Parser parser, BINDING *bindings)
{
  while (bindings) {
    BINDING *b = bindings;

    /* startNamespaceDeclHandler will have been called for this
     * binding in addBindings(), so call the end handler now.
     */
    if (endNamespaceDeclHandler)
        endNamespaceDeclHandler(handlerArg, b->prefix->name);

    bindings = bindings->nextTagBinding;
    b->nextTagBinding = freeBindingList;
    freeBindingList = b;
    b->prefix->binding = b->prevPrefixBinding;
  }
}